

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundShape.cpp
# Opt level: O0

void __thiscall
btCompoundShape::calculateLocalInertia(btCompoundShape *this,btScalar mass,btVector3 *inertia)

{
  btScalar *pbVar1;
  btVector3 *in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  btScalar lz;
  btScalar ly;
  btScalar lx;
  btVector3 halfExtents;
  btVector3 aabbMax;
  btVector3 aabbMin;
  btTransform ident;
  btTransform *this_00;
  btVector3 *this_01;
  btTransform *in_stack_ffffffffffffff40;
  btVector3 *this_02;
  btVector3 local_88;
  btVector3 local_78;
  btVector3 local_68;
  btTransform local_58;
  btVector3 *local_18;
  float local_c;
  
  this_00 = &local_58;
  local_18 = in_RSI;
  local_c = in_XMM0_Da;
  btTransform::btTransform(this_00);
  btTransform::setIdentity(in_stack_ffffffffffffff40);
  this_02 = &local_68;
  btVector3::btVector3(this_02);
  this_01 = &local_78;
  btVector3::btVector3(this_01);
  (**(code **)(*in_RDI + 0x10))(in_RDI,this_00,this_02,this_01);
  operator-(this_02,this_01);
  local_88 = ::operator*(this_02,this_01->m_floats);
  pbVar1 = btVector3::x(&local_88);
  fVar2 = *pbVar1 * 2.0;
  pbVar1 = btVector3::y(&local_88);
  fVar3 = *pbVar1 * 2.0;
  pbVar1 = btVector3::z(&local_88);
  fVar4 = *pbVar1 * 2.0;
  fVar5 = local_c / 12.0;
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  *pbVar1 = fVar5 * (fVar3 * fVar3 + fVar4 * fVar4);
  fVar5 = local_c / 12.0;
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  pbVar1[1] = fVar5 * (fVar2 * fVar2 + fVar4 * fVar4);
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  pbVar1[2] = (local_c / 12.0) * (fVar2 * fVar2 + fVar3 * fVar3);
  return;
}

Assistant:

void	btCompoundShape::calculateLocalInertia(btScalar mass,btVector3& inertia) const
{
	//approximation: take the inertia from the aabb for now
	btTransform ident;
	ident.setIdentity();
	btVector3 aabbMin,aabbMax;
	getAabb(ident,aabbMin,aabbMax);

	btVector3 halfExtents = (aabbMax-aabbMin)*btScalar(0.5);

	btScalar lx=btScalar(2.)*(halfExtents.x());
	btScalar ly=btScalar(2.)*(halfExtents.y());
	btScalar lz=btScalar(2.)*(halfExtents.z());

	inertia[0] = mass/(btScalar(12.0)) * (ly*ly + lz*lz);
	inertia[1] = mass/(btScalar(12.0)) * (lx*lx + lz*lz);
	inertia[2] = mass/(btScalar(12.0)) * (lx*lx + ly*ly);

}